

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

int asn1_string_get_int64(int64_t *out,ASN1_STRING *a,int type)

{
  int iVar1;
  bool bVar2;
  undefined4 uStack_38;
  int fits_in_i64;
  int64_t i64;
  uint64_t v;
  ASN1_STRING *pAStack_20;
  int type_local;
  ASN1_STRING *a_local;
  int64_t *out_local;
  
  v._4_4_ = type;
  pAStack_20 = a;
  a_local = (ASN1_STRING *)out;
  iVar1 = asn1_string_get_abs_uint64((uint64_t *)&i64,a,type);
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    if (((pAStack_20->type & 0x100U) == 0) || (i64 == 0)) {
      _uStack_38 = i64;
      bVar2 = -1 < i64;
    }
    else {
      _uStack_38 = -i64;
      bVar2 = 0 < i64;
    }
    if (bVar2) {
      a_local->length = uStack_38;
      a_local->type = fits_in_i64;
      out_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0xc,0,0xc4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x151);
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int asn1_string_get_int64(int64_t *out, const ASN1_STRING *a, int type) {
  uint64_t v;
  if (!asn1_string_get_abs_uint64(&v, a, type)) {
    return 0;
  }
  int64_t i64;
  int fits_in_i64;
  // Check |v != 0| to handle manually-constructed negative zeros.
  if ((a->type & V_ASN1_NEG) && v != 0) {
    i64 = (int64_t)(0u - v);
    fits_in_i64 = i64 < 0;
  } else {
    i64 = (int64_t)v;
    fits_in_i64 = i64 >= 0;
  }
  if (!fits_in_i64) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return 0;
  }
  *out = i64;
  return 1;
}